

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  mapped_type *this_00;
  reference pvVar7;
  FileLinesType *curFileLines_1;
  int local_7c8;
  int ci;
  int nr;
  int tagCount;
  vector<int,_std::allocator<int>_> *local_7b8;
  FileLinesType *curFileLines;
  string line;
  undefined1 local_770 [8];
  ostringstream cmCTestLog_msg_2;
  long local_5f8;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0 [32];
  undefined1 local_390 [8];
  ostringstream cmCTestLog_msg_1;
  string local_210 [32];
  undefined1 local_1f0 [8];
  ostringstream cmCTestLog_msg;
  string local_78 [55];
  allocator local_41;
  undefined1 local_40 [8];
  string fileName;
  char **atts_local;
  string *name_local;
  XMLParser *this_local;
  
  fileName.field_2._8_8_ = atts;
  bVar2 = std::operator==(name,"package");
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)&this->PackageName,*(char **)(fileName.field_2._8_8_ + 8));
    std::__cxx11::string::operator=((string *)&this->PackagePath,"");
    return;
  }
  bVar2 = std::operator==(name,"sourcefile");
  if (!bVar2) {
    bVar2 = std::operator==(name,"line");
    if (!bVar2) {
      return;
    }
    ci = 0;
    local_7c8 = -1;
    curFileLines_1._4_4_ = -1;
    while( true ) {
      iVar4 = strcmp(*(char **)(fileName.field_2._8_8_ + (long)ci * 8),"ci");
      if (iVar4 == 0) {
        curFileLines_1._4_4_ = atoi(*(char **)(fileName.field_2._8_8_ + (long)(ci + 1) * 8));
      }
      else {
        iVar4 = strcmp(*(char **)(fileName.field_2._8_8_ + (long)ci * 8),"nr");
        if (iVar4 == 0) {
          local_7c8 = atoi(*(char **)(fileName.field_2._8_8_ + (long)(ci + 1) * 8));
        }
      }
      if ((-1 < curFileLines_1._4_4_) && (0 < local_7c8)) break;
      ci = ci + 1;
    }
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->Coverage->TotalCoverage,&this->FilePath);
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(this_00);
    if (bVar2) {
      return;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(local_7c8 + -1));
    *pvVar7 = curFileLines_1._4_4_;
    return;
  }
  pcVar6 = *(char **)(fileName.field_2._8_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar6,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar2 = std::operator==(&this->PackagePath,"");
  if (bVar2) {
    std::__cxx11::string::string(local_78,(string *)local_40);
    iVar4 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xe])(this,local_78);
    std::__cxx11::string::~string(local_78);
    if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      poVar5 = std::operator<<((ostream *)local_1f0,"Cannot find file: ");
      poVar5 = std::operator<<(poVar5,(string *)&this->PackageName);
      poVar5 = std::operator<<(poVar5,"/");
      poVar5 = std::operator<<(poVar5,(string *)local_40);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                   ,0x32,pcVar6,false);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      this->Coverage->Error = this->Coverage->Error + 1;
      goto LAB_00513445;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_390);
  poVar5 = std::operator<<((ostream *)local_390,"Reading file: ");
  poVar5 = std::operator<<(poVar5,(string *)local_40);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
               ,0x3a,pcVar6,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string(local_3b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_390);
  std::operator+(&local_3f0,&this->PackagePath,"/");
  std::operator+(&local_3d0,&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::operator=((string *)&this->FilePath,(string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_5f8,pcVar6,_S_in);
  bVar3 = std::ios::operator!((ios *)((long)&local_5f8 + *(long *)(local_5f8 + -0x18)));
  if ((bVar3 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
    poVar5 = std::operator<<((ostream *)local_770,"Jacoco Coverage: Error opening ");
    poVar5 = std::operator<<(poVar5,(string *)&this->FilePath);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                 ,0x42,pcVar6,false);
    std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
  }
  std::__cxx11::string::string((string *)&curFileLines);
  local_7b8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->Coverage->TotalCoverage,&this->FilePath);
  bVar2 = std::ios::operator_cast_to_bool((ios *)((long)&local_5f8 + *(long *)(local_5f8 + -0x18)));
  if (bVar2) {
    tagCount = -1;
    std::vector<int,_std::allocator<int>_>::push_back(local_7b8,&tagCount);
  }
  while (bVar2 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)&local_5f8,(string *)&curFileLines,(bool *)0x0,-1), bVar2) {
    nr = -1;
    std::vector<int,_std::allocator<int>_>::push_back(local_7b8,&nr);
  }
  std::__cxx11::string::~string((string *)&curFileLines);
  std::ifstream::~ifstream(&local_5f8);
LAB_00513445:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

virtual void StartElement(const std::string& name,
      const char** atts)
      {
      if(name == "package")
        {
        this->PackageName = atts[1];
        this->PackagePath = "";
        }
      else if(name == "sourcefile")
        {
        std::string fileName = atts[1];

        if (this->PackagePath == "")
          {
          if(!this->FindPackagePath(fileName))
            {
            cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot find file: "
              << this->PackageName << "/" << fileName << std::endl);
            this->Coverage.Error++;
            return;
            }
          }

        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
          "Reading file: " << fileName << std::endl,
          this->Coverage.Quiet);

        this->FilePath = this->PackagePath + "/" + fileName;
        cmsys::ifstream fin(this->FilePath.c_str());
        if (!fin)
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Jacoco Coverage: Error opening " << this->FilePath
                     << std::endl);
          }
        std::string line;
        FileLinesType& curFileLines =
          this->Coverage.TotalCoverage[this->FilePath];
        if(fin)
          {
          curFileLines.push_back(-1);
          }
        while(cmSystemTools::GetLineFromStream(fin, line))
          {
          curFileLines.push_back(-1);
          }
        }
      else if(name == "line")
        {
        int tagCount = 0;
        int nr = -1;
        int ci = -1;
        while(true)
          {
          if(strcmp(atts[tagCount],"ci") == 0)
            {
            ci = atoi(atts[tagCount+1]);
            }
          else if (strcmp(atts[tagCount],"nr") == 0)
            {
            nr = atoi(atts[tagCount+1]);
            }
          if (ci > -1 && nr > 0)
            {
            FileLinesType& curFileLines=
              this->Coverage.TotalCoverage[this->FilePath];
            if(!curFileLines.empty())
               {
               curFileLines[nr-1] = ci;
               }
            break;
            }
          ++tagCount;
          }
        }
      }